

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase58::run(TestCase58 *this)

{
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Builder builder_01;
  Builder root;
  MallocMessageBuilder builder;
  StructBuilder local_208;
  undefined8 local_1e0;
  SegmentBuilder *pSStack_1d8;
  WirePointer *pWStack_1d0;
  void *pvStack_1c8;
  WirePointer *pWStack_1c0;
  StructDataBitCount local_1b8;
  StructPointerCount SStack_1b4;
  undefined2 uStack_1b2;
  undefined8 local_1b0;
  SegmentBuilder *pSStack_1a8;
  CapTableBuilder *pCStack_1a0;
  WirePointer *pWStack_198;
  undefined8 uStack_190;
  undefined8 local_188;
  PointerBuilder local_178;
  void *pvStack_160;
  WirePointer *local_158;
  undefined8 in_stack_fffffffffffffeb0;
  SegmentBuilder *in_stack_fffffffffffffeb8;
  SegmentBuilder *pSVar1;
  CapTableBuilder *in_stack_fffffffffffffec0;
  CapTableBuilder *pCVar2;
  WirePointer *in_stack_fffffffffffffec8;
  WirePointer *pWVar3;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  local_178.segment = in_stack_fffffffffffffeb8;
  local_178.capTable = in_stack_fffffffffffffec0;
  local_178.pointer = in_stack_fffffffffffffec8;
  MessageBuilder::getRootInternal
            ((Builder *)&stack0xfffffffffffffeb8,&local_f8.super_MessageBuilder);
  pSVar1 = local_178.segment;
  pCVar2 = local_178.capTable;
  pWVar3 = local_178.pointer;
  PointerBuilder::initStruct(&local_208,&local_178,(StructSize)0x140006);
  builder_01._builder.capTable = (CapTableBuilder *)pSVar1;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffeb0;
  builder_01._builder.data = pCVar2;
  builder_01._builder.pointers = pWVar3;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffed0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffed0 >> 0x30);
  initTestMessage(builder_01);
  StructBuilder::asReader(&local_208);
  local_188 = local_158;
  pWStack_198 = local_178.pointer;
  uStack_190 = pvStack_160;
  pSStack_1a8 = local_178.segment;
  pCStack_1a0 = local_178.capTable;
  local_1b0 = 0x636fd8;
  reader.reader.segment = &(local_178.segment)->super_SegmentReader;
  reader.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x636fd8;
  reader.reader.capTable = &(local_178.capTable)->super_CapTableReader;
  reader.reader.data = local_178.pointer;
  reader.reader.pointers = (WirePointer *)pvStack_160;
  reader.reader._32_8_ = local_158;
  reader.reader._40_8_ = in_stack_fffffffffffffeb0;
  checkDynamicTestMessage(reader);
  pvStack_160 = local_208.data;
  local_158 = local_208.pointers;
  local_178.capTable = (CapTableBuilder *)local_208.segment;
  local_178.pointer = (WirePointer *)local_208.capTable;
  local_178.segment = (SegmentBuilder *)(schemas::s_a0a8f314b80b63fd + 0x48);
  StructBuilder::asReader((StructBuilder *)&local_178.capTable);
  reader_00.reader.segment = (SegmentReader *)uStack_128;
  reader_00.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x636fd8;
  reader_00.reader.capTable = (CapTableReader *)local_120;
  reader_00.reader.data = (void *)uStack_118;
  reader_00.reader.pointers = (WirePointer *)local_110;
  reader_00.reader._32_8_ = uStack_108;
  reader_00.reader._40_8_ = local_100;
  checkDynamicTestMessage(reader_00);
  pSStack_1d8 = local_208.segment;
  pWStack_1d0 = (WirePointer *)local_208.capTable;
  pvStack_1c8 = local_208.data;
  pWStack_1c0 = local_208.pointers;
  local_1b8 = local_208.dataSize;
  SStack_1b4 = local_208.pointerCount;
  uStack_1b2 = local_208._38_2_;
  local_1e0 = 0x636fd8;
  builder_00.builder.segment = local_208.segment;
  builder_00.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x636fd8;
  builder_00.builder.capTable = local_208.capTable;
  builder_00.builder.data = local_208.data;
  builder_00.builder.pointers = local_208.pointers;
  builder_00.builder.dataSize = local_208.dataSize;
  builder_00.builder.pointerCount = local_208.pointerCount;
  builder_00.builder._38_2_ = local_208._38_2_;
  checkDynamicTestMessage(builder_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(DynamicApi, Read) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  initTestMessage(root);

  checkDynamicTestMessage(toDynamic(root.asReader()));
  checkDynamicTestMessage(toDynamic(root).asReader());
  checkDynamicTestMessage(toDynamic(root));
}